

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCNarrowPhaseCollider.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChNarrowPhaseCollider::ChNarrowPhaseCollider(ChNarrowPhaseCollider *this)

{
  undefined1 auVar1 [32];
  
  this->_vptr_ChNarrowPhaseCollider = (_func_int **)&PTR__ChNarrowPhaseCollider_0118e400;
  (this->T).m_data[0] = 0.0;
  (this->T).m_data[1] = 0.0;
  (this->T).m_data[2] = 0.0;
  (this->T1).m_data[0] = 0.0;
  (this->T1).m_data[1] = 0.0;
  (this->T1).m_data[2] = 0.0;
  (this->T2).m_data[0] = 0.0;
  (this->T2).m_data[1] = 0.0;
  (this->T2).m_data[2] = 0.0;
  this->num_collision_pairs = 0;
  auVar1 = ZEXT432(0) << 0x40;
  this->pairs = (vector<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
                 )auVar1._0_24_;
  this->num_bv_tests = auVar1._24_4_;
  this->num_geo_tests = auVar1._28_4_;
  return;
}

Assistant:

ChNarrowPhaseCollider::ChNarrowPhaseCollider() {
    // initially reserve a bit of space to contact array,
    // to avoid many reallocations if resizing needed for enlarging it.
    pairs.clear();
    num_collision_pairs = 0;
    num_bv_tests = 0;
    num_geo_tests = 0;
}